

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
llvm::cl::TokenizeWindowsCommandLine
          (cl *this,StringRef Src,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
          bool MarkEOLs)

{
  ulong uVar1;
  char *I;
  int iVar2;
  StringRef Src_00;
  StringRef S;
  StringRef SVar3;
  StringRef SVar4;
  char C;
  SmallString<128U> Token;
  cl local_d1;
  char *local_d0;
  StringSaver *local_c8;
  SmallString<128U> local_c0;
  
  local_c8 = (StringSaver *)Src.Length;
  SVar4.Length = Src.Data;
  local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &local_c0.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
  local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  if (SVar4.Length != (char *)0x0) {
    iVar2 = 0;
    I = (char *)0x0;
    do {
      if (SVar4.Length <= I) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                      ,0xef,"char llvm::StringRef::operator[](size_t) const");
      }
      local_d1 = this[(long)I];
      uVar1 = (ulong)(byte)local_d1;
      if (iVar2 == 1) {
        if ((byte)local_d1 < 0x23) {
          if ((0x100002600U >> (uVar1 & 0x3f) & 1) != 0) {
            SVar3.Length._0_4_ =
                 local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
            SVar3.Data = (char *)local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                                 super_SmallVectorTemplateBase<char,_true>.
                                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                 BeginX;
            SVar3.Length._4_4_ = 0;
            SVar3 = StringSaver::save(local_c8,SVar3);
            local_d0 = SVar3.Data;
            SmallVectorTemplateBase<const_char_*,_true>::push_back
                      ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_d0);
            local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size = 0;
            goto joined_r0x001499a2;
          }
LAB_001499ed:
          iVar2 = 2;
          if (uVar1 == 0x22) goto LAB_00149a42;
        }
LAB_001499f9:
        if (local_d1 == (cl)0x5c) {
          Src_00.Length = (size_t)SVar4.Length;
          Src_00.Data = (char *)this;
          I = (char *)parseBackslash(Src_00,(size_t)I,&local_c0);
        }
        else {
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)&local_c0,(char *)&local_d1);
        }
LAB_00149a3c:
        iVar2 = 1;
      }
      else if (iVar2 == 0) {
        if (0x22 < (byte)local_d1) goto LAB_001499f9;
        if ((0x100002600U >> (uVar1 & 0x3f) & 1) == 0) goto LAB_001499ed;
joined_r0x001499a2:
        iVar2 = 0;
        if (((char)NewArgv != '\0') && (iVar2 = 0, local_d1 == (cl)0xa)) {
          iVar2 = 0;
          local_d0 = (char *)0x0;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_d0);
        }
      }
      else {
        if (local_d1 == (cl)0x22) goto LAB_00149a3c;
        if (local_d1 == (cl)0x5c) {
          SVar4.Data = (char *)this;
          I = (char *)parseBackslash(SVar4,(size_t)I,&local_c0);
        }
        else {
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)&local_c0,(char *)&local_d1);
        }
        iVar2 = 2;
      }
LAB_00149a42:
      I = I + 1;
    } while (I != SVar4.Length);
    if (local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size != 0) {
      S.Length._0_4_ =
           local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
           super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
           super_SmallVectorBase.Size;
      S.Data = (char *)local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                       super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      S.Length._4_4_ = 0;
      SVar4 = StringSaver::save(local_c8,S);
      local_d0 = SVar4.Data;
      SmallVectorTemplateBase<const_char_*,_true>::push_back
                ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_d0);
    }
  }
  if ((char)NewArgv != '\0') {
    local_d0 = (char *)0x0;
    SmallVectorTemplateBase<const_char_*,_true>::push_back
              ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_d0);
  }
  if ((SmallVectorStorage<char,_128U> *)
      local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX !=
      &local_c0.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>) {
    free(local_c0.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void cl::TokenizeWindowsCommandLine(StringRef Src, StringSaver &Saver,
                                    SmallVectorImpl<const char *> &NewArgv,
                                    bool MarkEOLs) {
  SmallString<128> Token;

  // This is a small state machine to consume characters until it reaches the
  // end of the source string.
  enum { INIT, UNQUOTED, QUOTED } State = INIT;
  for (size_t I = 0, E = Src.size(); I != E; ++I) {
    char C = Src[I];

    // INIT state indicates that the current input index is at the start of
    // the string or between tokens.
    if (State == INIT) {
      if (isWhitespace(C)) {
        // Mark the end of lines in response files
        if (MarkEOLs && C == '\n')
          NewArgv.push_back(nullptr);
        continue;
      }
      if (C == '"') {
        State = QUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        State = UNQUOTED;
        continue;
      }
      Token.push_back(C);
      State = UNQUOTED;
      continue;
    }

    // UNQUOTED state means that it's reading a token not quoted by double
    // quotes.
    if (State == UNQUOTED) {
      // Whitespace means the end of the token.
      if (isWhitespace(C)) {
        NewArgv.push_back(Saver.save(StringRef(Token)).data());
        Token.clear();
        State = INIT;
        // Mark the end of lines in response files
        if (MarkEOLs && C == '\n')
          NewArgv.push_back(nullptr);
        continue;
      }
      if (C == '"') {
        State = QUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        continue;
      }
      Token.push_back(C);
      continue;
    }

    // QUOTED state means that it's reading a token quoted by double quotes.
    if (State == QUOTED) {
      if (C == '"') {
        State = UNQUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        continue;
      }
      Token.push_back(C);
    }
  }
  // Append the last token after hitting EOF with no whitespace.
  if (!Token.empty())
    NewArgv.push_back(Saver.save(StringRef(Token)).data());
  // Mark the end of response files
  if (MarkEOLs)
    NewArgv.push_back(nullptr);
}